

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseConfig.cpp
# Opt level: O2

optional<ConfigKey> * __thiscall
ConfigKey::parse(optional<ConfigKey> *__return_storage_ptr__,ConfigKey *this,string_view value)

{
  bool bVar1;
  pointer pCVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  vector<ConfigKey,_std::allocator<ConfigKey>_> local_40;
  
  available();
  pCVar2 = local_40.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pCVar2 == local_40.super__Vector_base<ConfigKey,_std::allocator<ConfigKey>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector(&local_40);
      (__return_storage_ptr__->super__Optional_base<ConfigKey,_false,_false>)._M_payload.
      super__Optional_payload<ConfigKey,_true,_false,_false>.super__Optional_payload_base<ConfigKey>
      ._M_engaged = false;
      return __return_storage_ptr__;
    }
    __y._M_str = (char *)value._M_len;
    __y._M_len = (size_t)this;
    __x._M_str = (pCVar2->key_)._M_dataplus._M_p;
    __x._M_len = (pCVar2->key_)._M_string_length;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) break;
    pCVar2 = pCVar2 + 1;
  }
  std::_Optional_payload_base<ConfigKey>::_Optional_payload_base<ConfigKey_const&>
            ((_Optional_payload_base<ConfigKey> *)__return_storage_ptr__,pCVar2);
  std::vector<ConfigKey,_std::allocator<ConfigKey>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::optional<ConfigKey> ConfigKey::parse(std::string_view value) {
    for (const auto &opt : ConfigKey::available()) {
        if (opt.key() == value) {
            return opt;
        }
    }
    return std::nullopt;
}